

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O2

double __thiscall
icu_63::double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  char sign;
  undefined4 uVar11;
  byte *unaff_RBP;
  int iVar12;
  long lVar13;
  uint uVar14;
  undefined7 uVar15;
  int iVar16;
  int *piVar17;
  int iVar18;
  byte *end;
  byte bVar19;
  uint uVar20;
  byte *pbVar21;
  byte bVar22;
  float fVar23;
  double dVar24;
  undefined8 uVar25;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp diy_fp;
  byte *local_3a0;
  uint local_394;
  byte *local_390;
  char *local_388;
  bool result_is_junk;
  ulong local_378;
  int *local_370;
  double local_368;
  undefined8 uStack_360;
  uint local_354;
  char *start;
  char buffer [782];
  
  iVar16 = (int)CONCAT71(in_register_00000009,read_as_double);
  *processed_characters_count = 0;
  if (length == 0) {
    return this->empty_string_value_;
  }
  end = (byte *)(input + length);
  uVar3 = this->flags_;
  local_368 = (double)CONCAT44(local_368._4_4_,iVar16);
  piVar17 = processed_characters_count;
  local_3a0 = (byte *)input;
  local_390._0_4_ = length;
  if ((uVar3 & 0x18) != 0) {
    bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3a0,(char *)end);
    if (!bVar2) {
      *processed_characters_count = (int)local_3a0 - (int)input;
      return this->empty_string_value_;
    }
    unaff_RBP = end;
    iVar16 = local_368._0_4_;
    if (local_3a0 != (byte *)input && (char)((uVar3 & 8) >> 3) == '\0') goto LAB_0024cde4;
  }
  bVar19 = *local_3a0;
  local_388 = input;
  if ((bVar19 == 0x2d) || (bVar19 == 0x2b)) {
    uVar7 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar19 == 0x2d);
    pbVar21 = local_3a0 + 1;
    buffer._0_8_ = pbVar21;
    bVar2 = AdvanceToNonspace<char_const*>((char **)buffer,(char *)end);
    if ((!bVar2) || (pbVar21 != (byte *)buffer._0_8_ && (char)((uVar3 & 0x20) >> 5) == '\0'))
    goto LAB_0024cde4;
    local_3a0 = (byte *)buffer._0_8_;
    bVar19 = *(byte *)buffer._0_8_;
    iVar16 = local_368._0_4_;
  }
  else {
    uVar7 = 0;
  }
  pbVar21 = (byte *)this->infinity_symbol_;
  bVar22 = (byte)uVar3;
  sign = (char)uVar7;
  if ((pbVar21 != (byte *)0x0) && (bVar19 == *pbVar21)) {
    bVar2 = ConsumeSubString<char_const*>((char **)&local_3a0,(char *)end,(char *)pbVar21);
    if (((bVar2) && (local_3a0 == end || (uVar3 & 0x14) != 0)) &&
       (((uVar3 & 4) != 0 ||
        (bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3a0,(char *)end), !bVar2)))) {
      *processed_characters_count = (int)local_3a0 - (int)local_388;
      if ((bool)sign != false) {
        return -INFINITY;
      }
      return INFINITY;
    }
    goto LAB_0024cde4;
  }
  pbVar21 = (byte *)this->nan_symbol_;
  if ((pbVar21 != (byte *)0x0) && (bVar19 == *pbVar21)) {
    bVar2 = ConsumeSubString<char_const*>((char **)&local_3a0,(char *)end,(char *)pbVar21);
    if (((bVar2) && (local_3a0 == end || (uVar3 & 0x14) != 0)) &&
       (((uVar3 & 4) != 0 ||
        (bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3a0,(char *)end), !bVar2)))) {
      *processed_characters_count = (int)local_3a0 - (int)local_388;
      if ((bool)sign != false) {
        return -NAN;
      }
      return NAN;
    }
    goto LAB_0024cde4;
  }
  iVar18 = 0;
  uVar11 = (undefined4)uVar7;
  if (bVar19 != 0x30) {
    uVar6 = 0;
    pbVar21 = local_3a0;
LAB_0024caa0:
    uVar8 = 0;
    uVar14 = 0;
    uVar20 = 0;
    do {
      pbVar4 = pbVar21;
      bVar1 = *pbVar4;
      piVar17 = (int *)CONCAT71((int7)((ulong)piVar17 >> 8),bVar1);
      iVar12 = (int)piVar17 + -0x30;
      if (9 < (byte)iVar12) {
        uVar10 = uVar6 & 0xff;
        if (iVar18 == 0) {
          uVar10 = 0;
        }
        uVar9 = (uint)uVar10;
        local_3a0 = pbVar4;
        local_394 = uVar11;
        if (bVar1 != 0x2e) {
          iVar12 = 0;
          goto LAB_0024ccde;
        }
        if (((bVar22 >> 2 | ~(byte)uVar10) & 1) == 0) goto LAB_0024cde4;
        iVar12 = 0;
        local_370 = processed_characters_count;
        if ((uVar10 & 1) != 0) goto LAB_0024cb09;
        local_3a0 = pbVar4 + 1;
        if (local_3a0 != end) {
          iVar12 = 0;
          if (iVar18 != 0) goto LAB_0024d025;
          iVar12 = 0;
          goto LAB_0024cc89;
        }
        uVar7 = uVar7 & 0xffffffff;
        uVar10 = uVar6;
        if (iVar18 == 0) {
          if (bVar19 == 0x30) goto LAB_0024cca6;
          goto LAB_0024cde4;
        }
        break;
      }
      if (iVar18 < 0x304) {
        lVar13 = (long)(int)uVar20;
        uVar20 = uVar20 + 1;
        buffer[lVar13] = bVar1;
        iVar18 = iVar18 + 1;
      }
      else {
        uVar8 = (ulong)((int)uVar8 + 1);
        uVar14 = CONCAT31((int3)((uint)iVar12 >> 8),bVar1 != 0x30 | (byte)uVar14);
      }
      if ((uVar6 & 1) == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = CONCAT71((int7)(uVar6 >> 8),(char)*pbVar4 < '8');
      }
      pbVar21 = pbVar4 + 1;
      uVar10 = uVar6;
    } while (pbVar4 + 1 != end);
    local_3a0 = pbVar4 + 1;
    sign = (char)uVar7;
    iVar12 = 0;
    local_370 = processed_characters_count;
    goto LAB_0024cb09;
  }
  pbVar21 = local_3a0 + 1;
  if (pbVar21 == end) {
LAB_0024cc0f:
    *processed_characters_count = (uint)local_390;
joined_r0x0024cc18:
    if ((bool)sign == false) {
      return 0.0;
    }
    return -0.0;
  }
  if (((uVar3 & 1) == 0) || ((*pbVar21 | 0x20) != 0x78)) {
    do {
      if (*pbVar21 != 0x30) {
        uVar6 = (ulong)CONCAT31((int3)(uVar3 >> 8),bVar22 >> 1);
        goto LAB_0024caa0;
      }
      pbVar21 = pbVar21 + 1;
    } while (pbVar21 != end);
    goto LAB_0024cc0f;
  }
  pbVar21 = local_3a0 + 2;
  if (pbVar21 == end) goto LAB_0024cde4;
  local_3a0 = pbVar21;
  local_394 = uVar3;
  local_390 = end;
  bVar2 = isDigit((int)(char)*pbVar21,0x10);
  if (!bVar2) goto LAB_0024cde4;
  local_368 = this->junk_string_value_;
  uVar25 = 0;
  iVar18 = (int)local_388;
  do {
    if (*pbVar21 != 0x30) {
      uVar7 = 0x18;
      if ((char)iVar16 != '\0') {
        uVar7 = 0x35;
      }
      lVar13 = 0;
      uStack_360 = 0;
      goto LAB_0024ce16;
    }
    pbVar21 = pbVar21 + 1;
  } while (pbVar21 != local_390);
  local_3a0 = pbVar21;
  if ((bool)sign == false) {
    local_368 = 0.0;
    uVar25 = 0;
    goto LAB_0024cf2b;
  }
LAB_0024cf1f:
  local_368 = -0.0;
  uVar25 = 0;
LAB_0024cf2b:
  if ((local_394 & 0x10) != 0) {
    uStack_360 = uVar25;
    AdvanceToNonspace<char_const*>((char **)&local_3a0,(char *)local_390);
    iVar18 = (int)local_388;
  }
  *processed_characters_count = (int)local_3a0 - iVar18;
  return local_368;
LAB_0024ce16:
  bVar19 = *pbVar21;
  lVar5 = (long)(int)(char)bVar19;
  local_3a0 = pbVar21;
  if ((int)(char)bVar19 - 0x30U < 10) {
    lVar5 = lVar5 + -0x30;
  }
  else if ((byte)(bVar19 + 0x9f) < 6) {
    lVar5 = lVar5 + -0x57;
  }
  else {
    if (5 < (byte)(bVar19 + 0xbf)) {
      if ((local_394 & 4) == 0) {
        bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3a0,(char *)local_390);
        iVar18 = (int)local_388;
        uVar25 = uStack_360;
        if (bVar2) {
          return local_368;
        }
      }
      goto LAB_0024ce6d;
    }
    lVar5 = lVar5 + -0x37;
  }
  lVar13 = lVar13 * 0x10 + lVar5;
  uVar6 = lVar13 >> (sbyte)uVar7;
  if ((int)uVar6 == 0) {
    pbVar21 = pbVar21 + 1;
    local_3a0 = pbVar21;
    if (pbVar21 == local_390) goto LAB_0024ce6d;
    goto LAB_0024ce16;
  }
  iVar16 = 1;
  bVar19 = 0;
  for (; 1 < (int)(uint)uVar6; uVar6 = (ulong)((uint)uVar6 >> 1)) {
    iVar16 = iVar16 + 1;
    bVar19 = bVar19 + 1;
  }
  uVar6 = lVar13 >> ((byte)iVar16 & 0x3f);
  local_354 = (uint)lVar13 & ~(-1 << ((byte)iVar16 & 0x1f));
  iVar16 = -iVar16;
  bVar22 = 1;
  local_378 = uVar7;
  local_370 = processed_characters_count;
  while (pbVar21 = pbVar21 + 1, pbVar21 != local_390) {
    bVar1 = *pbVar21;
    bVar2 = isDigit((int)(char)bVar1,0x10);
    if (!bVar2) break;
    bVar22 = bVar22 & bVar1 == 0x30;
    iVar16 = iVar16 + -4;
  }
  processed_characters_count = local_370;
  local_3a0 = pbVar21;
  if (((local_394 & 4) == 0) &&
     (bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3a0,(char *)local_390), bVar2)) {
    return local_368;
  }
  uVar3 = 1 << (bVar19 & 0x1f);
  if ((int)uVar3 < (int)local_354) {
    uVar6 = uVar6 + 1;
  }
  else if (local_354 == uVar3) {
    uVar6 = uVar6 + ((byte)(~bVar22 | (byte)uVar6) & 1);
  }
  bVar2 = (uVar6 >> (local_378 & 0x3f) & 1) != 0;
  diy_fp.f_ = (ulong)((uint)bVar2 - iVar16);
  diy_fp._8_8_ = local_378;
  local_368 = (double)Double::DiyFpToUint64((Double *)((long)uVar6 >> bVar2),diy_fp);
  uVar25 = 0;
  iVar18 = (int)local_388;
  goto LAB_0024cf2b;
LAB_0024ce6d:
  if ((bool)sign != false) {
    if (lVar13 == 0) goto LAB_0024cf1f;
    lVar13 = -lVar13;
  }
  local_368 = (double)lVar13;
  goto LAB_0024cf2b;
LAB_0024cc89:
  if (*local_3a0 != 0x30) goto LAB_0024d025;
  local_3a0 = local_3a0 + 1;
  if (local_3a0 == end) {
    *processed_characters_count = (uint)local_390;
    goto joined_r0x0024cc18;
  }
  iVar12 = iVar12 + -1;
  goto LAB_0024cc89;
  while( true ) {
    if (iVar18 < 0x304) {
      lVar13 = (long)(int)uVar20;
      uVar20 = uVar20 + 1;
      buffer[lVar13] = bVar1;
      iVar18 = iVar18 + 1;
      iVar12 = iVar12 + -1;
    }
    else {
      uVar6 = CONCAT71(uVar15,bVar1 != 0x30 | (byte)uVar14);
      uVar14 = (uint)uVar6;
    }
    local_3a0 = local_3a0 + 1;
    if (local_3a0 == end) break;
LAB_0024d025:
    bVar1 = *local_3a0;
    uVar15 = (undefined7)(uVar6 >> 8);
    uVar6 = CONCAT71(uVar15,bVar1);
    if (9 < (byte)(bVar1 - 0x30)) goto LAB_0024ccde;
  }
  goto LAB_0024cb09;
LAB_0024ccde:
  if (((bVar19 != 0x30) && (iVar12 == 0)) && (iVar18 == 0)) goto LAB_0024cde4;
  if ((*local_3a0 | 0x20) == 0x65) {
    if (((~(byte)uVar10 | bVar22 >> 2) & 1) == 0) goto LAB_0024cde4;
    local_370 = processed_characters_count;
    if ((uVar10 & 1) != 0) goto LAB_0024cb09;
    pbVar21 = local_3a0 + 1;
    if ((pbVar21 == end) ||
       ((((bVar19 = *pbVar21, bVar19 == 0x2d || (bVar22 = 0x2b, bVar19 == 0x2b)) &&
         (pbVar21 = local_3a0 + 2, bVar22 = bVar19, local_390._0_4_ = uVar9, pbVar21 == end)) ||
        ((local_390._0_4_ = uVar9, pbVar21 == end ||
         (bVar19 = *pbVar21, (byte)(bVar19 - 0x3a) < 0xf6)))))) {
      local_3a0 = pbVar21;
      if ((uVar3 & 4) == 0) goto LAB_0024cde4;
      goto LAB_0024cb09;
    }
    local_378 = CONCAT44(local_378._4_4_,iVar12);
    iVar16 = 0;
    do {
      pbVar21 = pbVar21 + 1;
      if ((iVar16 < 0x6666666) || ((iVar18 = 0x3fffffff, iVar16 == 0x6666666 && (bVar19 < 0x34)))) {
        iVar18 = (uint)bVar19 + iVar16 * 10 + -0x30;
      }
      iVar16 = iVar18;
    } while ((pbVar21 != end) && (bVar19 = *pbVar21, (byte)(bVar19 - 0x30) < 10));
    iVar18 = -iVar16;
    if (bVar22 != 0x2d) {
      iVar18 = iVar16;
    }
    iVar12 = iVar12 + iVar18;
    local_3a0 = pbVar21;
  }
  if (((uVar3 & 0x14) != 0) || (local_3a0 == end)) {
    local_370 = processed_characters_count;
    if ((uVar3 & 4) == 0) {
      local_378 = CONCAT44(local_378._4_4_,uVar14);
      local_390._0_4_ = uVar9;
      bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3a0,(char *)end);
      uVar10 = (ulong)(uint)local_390;
      uVar14 = (uint)local_378;
      if (bVar2) goto LAB_0024cde4;
    }
    if ((uVar3 & 0x10) != 0) {
      local_390._0_4_ = (uint)uVar10;
      AdvanceToNonspace<char_const*>((char **)&local_3a0,(char *)end);
      uVar10 = (ulong)(uint)local_390;
    }
    sign = (char)local_394;
    iVar16 = local_368._0_4_;
LAB_0024cb09:
    if ((uVar10 & 1) != 0) {
      start = buffer;
      dVar24 = RadixStringToIeee<3,char*>
                         (&start,buffer + (int)uVar20,(bool)sign,SUB41((uVar3 & 4) >> 2,0),
                          this->junk_string_value_,SUB41(iVar16,0),&result_is_junk);
      *local_370 = (int)local_3a0 - (int)local_388;
      return dVar24;
    }
    uVar8 = (ulong)(uint)((int)uVar8 + iVar12);
LAB_0024cca6:
    if ((uVar14 & 1) != 0) {
      lVar13 = (long)(int)uVar20;
      uVar20 = uVar20 + 1;
      buffer[lVar13] = '1';
      uVar8 = (ulong)((int)uVar8 - 1);
    }
    buffer[(int)uVar20] = '\0';
    buffer_00.start_ = (char *)(ulong)uVar20;
    if ((char)iVar16 == '\0') {
      buffer_01._8_8_ = uVar8;
      buffer_01.start_ = buffer_00.start_;
      fVar23 = Strtof((double_conversion *)buffer,buffer_01,iVar16);
      dVar24 = (double)fVar23;
    }
    else {
      buffer_00._8_8_ = uVar8;
      dVar24 = Strtod((double_conversion *)buffer,buffer_00,iVar16);
    }
    *local_370 = (int)local_3a0 - (int)local_388;
    if (sign == '\0') {
      return dVar24;
    }
    return -dVar24;
  }
LAB_0024cde4:
  return this->junk_string_value_;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}